

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinargs.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer poVar4;
  pointer poVar5;
  pointer ppcVar6;
  ostream *poVar7;
  size_t sVar8;
  option_results *poVar9;
  ostream *poVar10;
  iterator __end1;
  long lVar11;
  int iVar12;
  ostream *poVar13;
  string *psVar14;
  iterator __begin1;
  pointer ppcVar15;
  undefined1 *puVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<argagg::definition> __l_04;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  parser argparser;
  ofstream output_file;
  ostringstream usage;
  allocator_type local_4be;
  allocator_type local_4bd;
  allocator_type local_4bc;
  allocator_type local_4bb;
  allocator_type local_4ba;
  allocator_type local_4b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  parser local_418;
  undefined1 local_400 [32];
  size_t *psStack_3e0;
  float local_3d8;
  size_t local_3d0;
  __node_base_ptr p_Stack_3c8;
  pointer local_3c0;
  pointer ppcStack_3b8;
  pointer local_3b0;
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [48];
  _Alloc_hider local_370;
  pointer local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_360;
  uint local_350;
  undefined8 **local_348 [2];
  undefined8 *local_338;
  code *local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined4 local_2f0;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined4 local_1d0;
  undefined1 local_1a8 [32];
  undefined1 *local_188 [2];
  undefined1 local_178 [64];
  ios_base local_138 [264];
  
  local_3a8 = (undefined1  [8])(local_3a0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"help","");
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-h","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"--help","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_3a0 + 0x18),__l,&local_4b9);
  local_370._M_p = (pointer)&aStack_360;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_370,"displays help information","");
  local_350 = 0;
  local_348[0] = &local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"verbose","");
  local_400._0_8_ = local_400 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"-v","");
  psStack_3e0 = &local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_3e0,"--verbose","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_400;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_328,__l_00,&local_4ba);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"increases verbosity","");
  local_2f0 = 0;
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"lorem-ipsum","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"--lorem-ipsum","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_438;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,__l_01,&local_4bb);
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
             ,"");
  local_290 = 0;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"sep","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"-s","");
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"--sep","");
  __l_02._M_len = 2;
  __l_02._M_array = &local_478;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,__l_02,&local_4bc);
  local_250 = &uStack_240;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"separator (default \',\')","");
  uStack_230._0_4_ = 1;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"output","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"-o","");
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"--output","");
  __l_03._M_len = 2;
  __l_03._M_array = &local_4b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_208,__l_03,&local_4bd);
  puVar16 = local_1e0;
  local_1f0[0] = puVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,"output filename (stdout if not specified)","");
  local_1d0 = 1;
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)local_3a8;
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::vector
            (&local_418.definitions,__l_04,&local_4be);
  lVar11 = -0x1e0;
  do {
    if (puVar16 != *(undefined1 **)(puVar16 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar16 + -0x10));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(puVar16 + -0x28));
    if (puVar16 + -0x38 != *(undefined1 **)(puVar16 + -0x48)) {
      operator_delete(*(undefined1 **)(puVar16 + -0x48));
    }
    puVar16 = puVar16 + -0x60;
    lVar11 = lVar11 + 0x60;
  } while (lVar11 != 0);
  lVar11 = 0;
  do {
    if (local_488 + lVar11 != *(undefined1 **)((long)local_498 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_498 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x40);
  lVar11 = 0;
  do {
    if (local_448 + lVar11 != *(undefined1 **)((long)local_458 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_458 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  lVar11 = 0;
  do {
    if ((void *)((long)&local_3d0 + lVar11) != *(void **)((long)&psStack_3e0 + lVar11)) {
      operator_delete(*(void **)((long)&psStack_3e0 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x40);
  lVar11 = 0;
  do {
    if (local_178 + lVar11 != *(undefined1 **)((long)local_188 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_188 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Joins all positional arguments together with a separator\n",0x39)
  ;
  pcVar2 = local_3a0 + 8;
  paVar1 = &local_4b8.field_2;
  local_3a8[0] = 10;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_3a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Usage: ",7);
  pcVar3 = *argv;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
  }
  else {
    sVar8 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," [options] ARG [ARG...]\n",0x18);
  local_3a8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_3a8,1);
  local_400._8_8_ = &p_Stack_3c8;
  local_400._16_8_ = 1;
  local_400._24_8_ = 0;
  psStack_3e0 = (size_t *)0x0;
  local_3d8 = 1.0;
  local_3d0 = 0;
  p_Stack_3c8 = (__node_base_ptr)0x0;
  local_3c0 = (pointer)0x0;
  ppcStack_3b8 = (pointer)0x0;
  local_3b0 = (pointer)0x0;
  argagg::parser::parse((parser_results *)local_3a8,&local_418,argc,argv);
  local_400._0_8_ = local_3a8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_400 + 8),
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_3a0);
  ppcVar6 = local_3c0;
  local_3c0 = local_368;
  ppcStack_3b8 = (pointer)aStack_360._M_allocated_capacity;
  local_3b0 = (pointer)aStack_360._8_8_;
  local_368 = (pointer)0x0;
  aStack_360._M_allocated_capacity = 0;
  aStack_360._8_8_ = 0;
  if ((ppcVar6 != (pointer)0x0) && (operator_delete(ppcVar6), local_368 != (pointer)0x0)) {
    operator_delete(local_368);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_3a0);
  local_3a8 = (undefined1  [8])pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"help","");
  poVar9 = argagg::parser_results::operator[]((parser_results *)local_400,(string *)local_3a8);
  poVar4 = (poVar9->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_start;
  poVar5 = (poVar9->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_3a8 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_3a8);
  }
  if (poVar5 == poVar4) {
    local_3a8 = (undefined1  [8])pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"verbose","");
    poVar9 = argagg::parser_results::operator[]((parser_results *)local_400,(string *)local_3a8);
    poVar4 = (poVar9->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar5 = (poVar9->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_3a8 != (undefined1  [8])pcVar2) {
      operator_delete((void *)local_3a8);
    }
    poVar7 = (ostream *)&g_dev_null;
    std::ofstream::open((char *)&g_dev_null,0x10e313);
    iVar12 = (int)((ulong)((long)poVar4 - (long)poVar5) >> 3);
    if (0 < iVar12) {
      poVar7 = (ostream *)&std::cerr;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verbose log level: ",0x13);
    poVar10 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
    local_3a8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_3a8,1);
    local_3a8 = (undefined1  [8])pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"sep","");
    poVar9 = argagg::parser_results::operator[]((parser_results *)local_400,(string *)local_3a8);
    local_4b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,",","");
    argagg::option_results::as<std::__cxx11::string>(&local_478,poVar9,&local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (local_3a8 != (undefined1  [8])pcVar2) {
      operator_delete((void *)local_3a8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"set separator to \'",0x12);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,local_478._M_dataplus._M_p,local_478._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'\n",2);
    std::ofstream::ofstream(local_3a8);
    local_4b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"output","");
    poVar9 = argagg::parser_results::operator[]((parser_results *)local_400,&local_4b8);
    poVar4 = (poVar9->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar9->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (poVar5 == poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"outputting to stdout\n",0x15);
      psVar14 = (string *)&std::cout;
    }
    else {
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"output","");
      poVar9 = argagg::parser_results::operator[]((parser_results *)local_400,&local_438);
      argagg::option_results::as<std::__cxx11::string>(&local_4b8,poVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      psVar14 = (string *)local_3a8;
      std::ofstream::open(psVar14,(_Ios_Openmode)&local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"outputting to file at \'",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
    }
    ppcVar6 = ppcStack_3b8;
    if (ppcStack_3b8 == local_3c0) {
      std::__cxx11::stringbuf::str();
      if (iVar12 < 0) {
        poVar7 = (ostream *)&g_dev_null;
      }
      else {
        poVar7 = (ostream *)&std::cerr;
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
      poVar7 = operator<<(poVar7,&local_418);
      local_438._M_dataplus._M_p._0_1_ = 10;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_438,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Not enough arguments\n",0x15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      iVar12 = 1;
    }
    else {
      poVar7 = (ostream *)&std::cerr;
      poVar10 = (ostream *)&std::cerr;
      if (iVar12 < 2) {
        poVar10 = (ostream *)&g_dev_null;
      }
      poVar13 = (ostream *)&std::cerr;
      if (iVar12 < 4) {
        poVar13 = (ostream *)&g_dev_null;
      }
      ppcVar15 = local_3c0;
      if (iVar12 < 3) {
        poVar7 = (ostream *)&g_dev_null;
      }
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"writing argument\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"argument is \'",0xd);
        pcVar3 = *ppcVar15;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar13->_vptr_basic_ostream[-3] + (int)poVar13);
        }
        else {
          sVar8 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar3,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\'\n",2);
        pcVar3 = *ppcVar15;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)psVar14 + (int)*(undefined8 *)(*(long *)psVar14 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar14,pcVar3,sVar8);
        }
        if (*ppcVar15 != ppcStack_3b8[-1]) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"writing separator\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)psVar14,local_478._M_dataplus._M_p,local_478._M_string_length);
        }
        ppcVar15 = ppcVar15 + 1;
      } while (ppcVar15 != ppcVar6);
      poVar7 = (ostream *)&g_dev_null;
      if (3 < iVar12) {
        poVar7 = (ostream *)&std::cerr;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"writing endl\b",0xd);
      local_4b8._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar14,(char *)&local_4b8,1);
      iVar12 = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"everything a-okay\n",0x12);
    }
    local_3a8 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf((filebuf *)local_3a0);
    std::ios_base::~ios_base((ios_base *)local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
  }
  else {
    std::ios_base::ios_base((ios_base *)&local_330);
    local_330 = std::terminate;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_250 = (undefined8 *)((ulong)local_250 & 0xffffffffffff0000);
    local_248 = 0;
    uStack_240 = 0;
    local_238 = 0;
    uStack_230 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    local_3a8 = (undefined1  [8])(argagg::fmt_ostream::vtable + 0x18);
    local_330 = (code *)0x111b28;
    local_338 = &std::cerr;
    std::__cxx11::stringbuf::str();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a8,local_478._M_dataplus._M_p,local_478._M_string_length);
    operator<<(poVar7,&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    argagg::fmt_ostream::~fmt_ostream((fmt_ostream *)local_3a8,&argagg::fmt_ostream::VTT);
    std::ios_base::~ios_base((ios_base *)&local_330);
    iVar12 = 0;
  }
  if (local_3c0 != (pointer)0x0) {
    operator_delete(local_3c0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_400 + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::~vector
            (&local_418.definitions);
  return iVar12;
}

Assistant:

int main(
  int argc,
  const char** argv)
{
  using argagg::parser_results;
  using argagg::parser;
  using std::cerr;
  using std::cout;
  using std::ofstream;
  using std::ostream;
  using std::ostringstream;
  using std::string;

  // Use an initializer list to define the argument parser. The first brace
  // starts the initializer list, the second brace starts the initializer list
  // for the definitions vector in the argagg::parser struct.
  parser argparser {{

      // Each entry here is an initializer list for an `argagg::definition`
      // struct.
      {
        // Name of the option. This is the key used to retrieve the flag parser
        // results.
        "help",

        // The strings ("flags") that must be matched to activate this option.
        {"-h", "--help"},

        // The help string that is streamed out when the argagg::parser object
        // itself is streamed out.
        "displays help information",

        // Number of arguments needed by this option. Should be 0 or 1.
        0},
      {
        "verbose", {"-v", "--verbose"},
        "increases verbosity", 0},
      {
        "lorem-ipsum", {"--lorem-ipsum"},
        "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do "
        "eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim "
        "ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut "
        "aliquip ex ea commodo consequat. Duis aute irure dolor in "
        "reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla "
        "pariatur. Excepteur sint occaecat cupidatat non proident, sunt in "
        "culpa qui officia deserunt mollit anim id est laborum.", 0},
      {
        "sep", {"-s", "--sep"},
        "separator (default ',')", 1},
      {
        "output", {"-o", "--output"},
        "output filename (stdout if not specified)", 1},
    }};

  // Define our usage text.
  ostringstream usage;
  usage
    << "Joins all positional arguments together with a separator\n"
    << '\n'
    << "Usage: " << argv[0] << " [options] ARG [ARG...]\n"
    << '\n';

  // Use our argument parser to... parse the command line arguments. If there
  // are any problems then just spit out the usage and help text and exit.
  argagg::parser_results args;
  try {
    args = argparser.parse(argc, argv);
  } catch (const std::exception& e) {
    argagg::fmt_ostream help(cerr);
    help << usage.str() << argparser << '\n'
         << "Encountered exception while parsing arguments: " << e.what()
         << '\n';
    return EXIT_FAILURE;
  }

  // If the help flag was specified then spit out the usage and help text and
  // exit.
  if (args["help"]) {
    argagg::fmt_ostream help(cerr);
    help << usage.str() << argparser;
    return EXIT_SUCCESS;
  }

  // Respect verbosity. Okay, the logging here is a little ludicrous. The point
  // I want to show here is that you can quickly get the number of times an
  // option shows up.
  int verbose_level = args["verbose"].count();

  // Set up our verbose log output stream selector that selects stderr if the
  // requested log level is lower than or equal to the currently set verbose
  // level.
  g_dev_null.open("/dev/null"); // portable? eh... simple? yes!
  auto vlog = [&](int level) -> ostream& {
      return verbose_level >= level ? cerr : g_dev_null;
    };

  vlog(1) << "verbose log level: " << verbose_level << '\n';

  // Use comma as the separator unless one was specified.
  auto sep = args["sep"].as<string>(",");
  vlog(1) << "set separator to '" << sep << "'\n";

  // Determine output stream.
  ofstream output_file;
  ostream* output = &std::cout;
  if (args["output"]) {
    string filename = args["output"];
    output_file.open(filename);
    output = &output_file;
    vlog(1) << "outputting to file at '" << filename << "'\n";
  } else {
    vlog(1) << "outputting to stdout\n";
  }

  // Join the arguments.
  if (args.count() < 1) {
    vlog(0) << usage.str() << argparser << '\n'
            << "Not enough arguments\n";
    return EXIT_FAILURE;
  }
  for (auto& arg : args.pos) {
    vlog(2) << "writing argument\n";
    vlog(4) << "argument is '" << arg << "'\n";
    *output << arg;
    if (arg != args.pos.back()) {
      vlog(3) << "writing separator\n";
      *output << sep;
    }
  }
  vlog(4) << "writing endl\b";
  *output << '\n';

  vlog(4) << "everything a-okay\n";
  return EXIT_SUCCESS;
}